

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

int bcf_sr_regions_seek(bcf_sr_regions_t *reg,char *seq)

{
  int iVar1;
  hts_itr_t *phVar2;
  
  reg->end = -1;
  reg->iseq = -1;
  reg->start = -1;
  iVar1 = khash_str2int_get(reg->seq_hash,seq,&reg->iseq);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else if (reg->regs == (_region_t *)0x0) {
    if (reg->itr != (hts_itr_t *)0x0) {
      hts_itr_destroy(reg->itr);
    }
    phVar2 = hts_itr_querys(reg->tbx->idx,seq,tbx_name2id,reg->tbx,hts_itr_query,tbx_readrec);
    reg->itr = phVar2;
    iVar1 = -(uint)(phVar2 == (hts_itr_t *)0x0);
  }
  else {
    reg->regs[reg->iseq].creg = -1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int bcf_sr_regions_seek(bcf_sr_regions_t *reg, const char *seq)
{
    reg->iseq = reg->start = reg->end = -1;
    if ( khash_str2int_get(reg->seq_hash, seq, &reg->iseq) < 0 ) return -1;  // sequence seq not in regions

    // using in-memory regions
    if ( reg->regs )
    {
        reg->regs[reg->iseq].creg = -1;
        return 0;
    }

    // reading regions from tabix
    if ( reg->itr ) tbx_itr_destroy(reg->itr);
    reg->itr = tbx_itr_querys(reg->tbx, seq);
    if ( reg->itr ) return 0;

    return -1;
}